

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTMain.cpp
# Opt level: O1

istream * safeGetline(istream *is,string *t)

{
  std::getline<char,std::char_traits<char>,std::allocator<char>>(is,(string *)t,'\n');
  if ((t->_M_string_length != 0) && ((t->_M_dataplus)._M_p[t->_M_string_length - 1] == '\r')) {
    std::__cxx11::string::pop_back();
  }
  return is;
}

Assistant:

std::istream& safeGetline(std::istream& is, std::string& t)
{
    // read a line until LF
    std::getline(is, t, '\n');
    
    // if last character is CR then remove it
    if (!t.empty() && t.back() == '\r')
        t.pop_back();
    
    return is;
}